

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O2

void pjpeg_destroy(pjpeg_t *pj)

{
  long lVar1;
  int i;
  long lVar2;
  
  if (pj != (pjpeg_t *)0x0) {
    lVar1 = 0x10;
    for (lVar2 = 0; lVar2 < pj->ncomponents; lVar2 = lVar2 + 1) {
      free(*(void **)((long)&pj->components->width + lVar1));
      lVar1 = lVar1 + 0x20;
    }
    free(pj->components);
    free(pj);
    return;
  }
  return;
}

Assistant:

void pjpeg_destroy(pjpeg_t *pj)
{
    if (!pj)
        return;

    for (int i = 0; i < pj->ncomponents; i++)
        free(pj->components[i].data);
    free(pj->components);

    free(pj);
}